

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O1

void writevector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *c,string *filename)

{
  char cVar1;
  int iVar2;
  pointer pbVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  ofstream myfile;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfailure to write file",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  pbVar3 = (c->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((c->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    bVar6 = true;
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,*(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar5),
                 *(long *)((long)&pbVar3->_M_string_length + lVar5));
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&(((c->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar5));
      cVar1 = (char)(string *)&local_230;
      if ((iVar2 == 0) && (bVar6)) {
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        bVar6 = false;
      }
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&(((c->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar5));
      if (iVar2 == 0) {
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      uVar4 = uVar4 + 1;
      pbVar3 = (c->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)(c->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5))
    ;
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writevector(vector<string> &c, string filename)
{
	ofstream myfile;
	myfile.open(filename);
	if (!myfile.is_open()) { cout << "\nfailure to write file" << endl; }
	bool firstC = true;
	for (int i = 0; i < c.size(); i++)
	{
		myfile << c[i];
		if (c[i] == ")" && firstC == true)
		{
			myfile << endl;
			firstC = false;
		}
		if (c[i] == ";")
			myfile << endl;

	}

}